

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_open_failure.c
# Opt level: O3

ssize_t my_read(archive *a,void *_private,void **buff)

{
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_open_failure.c"
                      ,L'.',0x75bcd15,"MAGIC",(long)*_private,"private->magic",(void *)0x0);
  *(int *)((long)_private + 8) = *(int *)((long)_private + 8) + 1;
  return (long)*(int *)((long)_private + 4);
}

Assistant:

static ssize_t
my_read(struct archive *a, void *_private, const void **buff)
{
	struct my_data *private = (struct my_data *)_private;
	(void)a; /* UNUSED */
	(void)buff; /* UNUSED */
	assertEqualInt(MAGIC, private->magic);
	++private->read_called;
	return (private->read_return);
}